

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gluTextureTestUtil.cpp
# Opt level: O2

void glu::TextureTestUtil::computeQuadTexCoordCube
               (vector<float,_std::allocator<float>_> *dst,CubeFace face,Vec2 *bottomLeft,
               Vec2 *topRight)

{
  float fVar1;
  float fVar2;
  float fVar3;
  long lVar4;
  long lVar5;
  pointer pfVar6;
  ulong uVar7;
  ulong uVar8;
  
  if (face < CUBEFACE_LAST) {
    uVar7 = (ulong)face;
    uVar8 = (ulong)*(uint *)(&DAT_0190eda0 + uVar7 * 4);
    lVar4 = *(long *)(&DAT_0190edb8 + uVar7 * 8);
    lVar5 = *(long *)(&DAT_0190ee18 + uVar7 * 8);
    fVar1 = *(float *)(&DAT_0190ed40 + uVar7 * 4);
    fVar2 = *(float *)(&DAT_0190ed58 + uVar7 * 4);
    fVar3 = *(float *)(&DAT_0190ed70 + uVar7 * 4);
    std::vector<float,_std::allocator<float>_>::resize(dst,0xc);
    pfVar6 = (dst->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
             super__Vector_impl_data._M_start;
    pfVar6[lVar5] = fVar3;
    pfVar6[lVar5 + 3] = fVar3;
    pfVar6[lVar5 + 6] = fVar3;
    pfVar6[lVar5 + 9] = fVar3;
    pfVar6[uVar8] = bottomLeft->m_data[0] * fVar1;
    pfVar6[uVar8 + 3] = bottomLeft->m_data[0] * fVar1;
    pfVar6[uVar8 + 6] = topRight->m_data[0] * fVar1;
    pfVar6[uVar8 + 9] = fVar1 * topRight->m_data[0];
    pfVar6[lVar4] = bottomLeft->m_data[1] * fVar2;
    pfVar6[lVar4 + 3] = topRight->m_data[1] * fVar2;
    pfVar6[lVar4 + 6] = bottomLeft->m_data[1] * fVar2;
    pfVar6[lVar4 + 9] = fVar2 * topRight->m_data[1];
  }
  return;
}

Assistant:

void computeQuadTexCoordCube (std::vector<float>& dst, tcu::CubeFace face, const tcu::Vec2& bottomLeft, const tcu::Vec2& topRight)
{
	int		sRow		= 0;
	int		tRow		= 0;
	int		mRow		= 0;
	float	sSign		= 1.0f;
	float	tSign		= 1.0f;
	float	mSign		= 1.0f;

	switch (face)
	{
		case tcu::CUBEFACE_NEGATIVE_X: mRow = 0; sRow = 2; tRow = 1; mSign = -1.0f;				   tSign = -1.0f;	break;
		case tcu::CUBEFACE_POSITIVE_X: mRow = 0; sRow = 2; tRow = 1;				sSign = -1.0f; tSign = -1.0f;	break;
		case tcu::CUBEFACE_NEGATIVE_Y: mRow = 1; sRow = 0; tRow = 2; mSign = -1.0f;				   tSign = -1.0f;	break;
		case tcu::CUBEFACE_POSITIVE_Y: mRow = 1; sRow = 0; tRow = 2;												break;
		case tcu::CUBEFACE_NEGATIVE_Z: mRow = 2; sRow = 0; tRow = 1; mSign = -1.0f; sSign = -1.0f; tSign = -1.0f;	break;
		case tcu::CUBEFACE_POSITIVE_Z: mRow = 2; sRow = 0; tRow = 1;							   tSign = -1.0f;	break;
		default:
			DE_ASSERT(DE_FALSE);
			return;
	}

	dst.resize(3*4);

	dst[0+mRow] = mSign;
	dst[3+mRow] = mSign;
	dst[6+mRow] = mSign;
	dst[9+mRow] = mSign;

	dst[0+sRow] = sSign * bottomLeft.x();
	dst[3+sRow] = sSign * bottomLeft.x();
	dst[6+sRow] = sSign * topRight.x();
	dst[9+sRow] = sSign * topRight.x();

	dst[0+tRow] = tSign * bottomLeft.y();
	dst[3+tRow] = tSign * topRight.y();
	dst[6+tRow] = tSign * bottomLeft.y();
	dst[9+tRow] = tSign * topRight.y();
}